

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O3

void __thiscall
BIP324Cipher::Initialize
          (BIP324Cipher *this,EllSwiftPubKey *their_pubkey,bool initiator,bool self_decrypt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  array<unsigned_char,_32UL> *t;
  CChainParams *pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  array<std::byte,_16UL> *paVar7;
  undefined8 uVar8;
  BIP324Cipher *pBVar9;
  optional<FSChaCha20Poly1305> *poVar10;
  bool bVar11;
  long in_FS_OFFSET;
  array<std::byte,_32UL> hkdf_32_okm;
  CHKDF_HMAC_SHA256_L32 hkdf;
  ECDHSecret ecdh_secret;
  string salt;
  string local_d8;
  array<std::byte,_32UL> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = Params();
  paVar3 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"bitcoin_v2_shared_secret","")
  ;
  paVar2 = &local_98.field_2;
  local_98.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(pCVar5->pchMessageStart)._M_elems;
  local_98._M_string_length = 4;
  local_98.field_2._M_allocated_capacity._4_4_ =
       local_98.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    uVar8 = local_78.field_2._M_allocated_capacity;
  }
  local_98._M_dataplus._M_p = (pointer)paVar2;
  if (local_78._M_string_length + 4 < 0x10 && (ulong)uVar8 < local_78._M_string_length + 4) {
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_98,0,0,local_78._M_dataplus._M_p,local_78._M_string_length);
  }
  else {
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_78,paVar2->_M_local_buf,4);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if (paVar4 == paVar1) {
    local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)paVar4;
  }
  local_58._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                             local_98.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  CKey::ComputeBIP324ECDHSecret
            ((ECDHSecret *)&local_78,&this->m_key,their_pubkey,&this->m_our_pubkey,initiator);
  CHKDF_HMAC_SHA256_L32::CHKDF_HMAC_SHA256_L32
            ((CHKDF_HMAC_SHA256_L32 *)&local_98,(uchar *)&local_78,0x20,&local_58);
  paVar2 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"initiator_L","");
  CHKDF_HMAC_SHA256_L32::Expand32((CHKDF_HMAC_SHA256_L32 *)&local_98,&local_d8,local_b8._M_elems);
  bVar11 = self_decrypt != initiator;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  pBVar9 = (BIP324Cipher *)&this->m_recv_l_cipher;
  if (bVar11) {
    pBVar9 = this;
  }
  std::optional<FSChaCha20>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (&pBVar9->m_send_l_cipher,&local_b8,&REKEY_INTERVAL);
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"initiator_P","");
  CHKDF_HMAC_SHA256_L32::Expand32((CHKDF_HMAC_SHA256_L32 *)&local_98,&local_d8,local_b8._M_elems);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  poVar10 = &this->m_recv_p_cipher;
  if (bVar11) {
    poVar10 = &this->m_send_p_cipher;
  }
  std::optional<FSChaCha20Poly1305>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (poVar10,&local_b8,&REKEY_INTERVAL);
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"responder_L","");
  CHKDF_HMAC_SHA256_L32::Expand32((CHKDF_HMAC_SHA256_L32 *)&local_98,&local_d8,local_b8._M_elems);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  pBVar9 = (BIP324Cipher *)&this->m_recv_l_cipher;
  if (!bVar11) {
    pBVar9 = this;
  }
  std::optional<FSChaCha20>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (&pBVar9->m_send_l_cipher,&local_b8,&REKEY_INTERVAL);
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"responder_P","");
  CHKDF_HMAC_SHA256_L32::Expand32((CHKDF_HMAC_SHA256_L32 *)&local_98,&local_d8,local_b8._M_elems);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  poVar10 = &this->m_send_p_cipher;
  if (bVar11) {
    poVar10 = &this->m_recv_p_cipher;
  }
  std::optional<FSChaCha20Poly1305>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (poVar10,&local_b8,&REKEY_INTERVAL);
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"garbage_terminators","");
  CHKDF_HMAC_SHA256_L32::Expand32((CHKDF_HMAC_SHA256_L32 *)&local_98,&local_d8,local_b8._M_elems);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  paVar7 = &this->m_recv_garbage_terminator;
  if (initiator) {
    paVar7 = &this->m_send_garbage_terminator;
  }
  *(undefined8 *)paVar7->_M_elems = local_b8._M_elems._0_8_;
  *(undefined8 *)(paVar7->_M_elems + 8) = local_b8._M_elems._8_8_;
  paVar7 = &this->m_send_garbage_terminator;
  if (initiator) {
    paVar7 = &this->m_recv_garbage_terminator;
  }
  *(undefined4 *)paVar7->_M_elems = local_b8._M_elems._16_4_;
  *(undefined4 *)(paVar7->_M_elems + 4) = local_b8._M_elems._20_4_;
  *(undefined4 *)(paVar7->_M_elems + 8) = local_b8._M_elems._24_4_;
  *(undefined4 *)(paVar7->_M_elems + 0xc) = local_b8._M_elems._28_4_;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"session_id","");
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)&local_98,&local_d8,(this->m_session_id)._M_elems);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  memory_cleanse(&local_78,0x20);
  memory_cleanse(&local_b8,0x20);
  memory_cleanse(&local_98,0x20);
  (this->m_key).fCompressed = false;
  t = (this->m_key).keydata._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  (this->m_key).keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_32UL> *)0x0;
  if (t != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&(this->m_key).keydata,t);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BIP324Cipher::Initialize(const EllSwiftPubKey& their_pubkey, bool initiator, bool self_decrypt) noexcept
{
    // Determine salt (fixed string + network magic bytes)
    const auto& message_header = Params().MessageStart();
    std::string salt = std::string{"bitcoin_v2_shared_secret"} + std::string(std::begin(message_header), std::end(message_header));

    // Perform ECDH to derive shared secret.
    ECDHSecret ecdh_secret = m_key.ComputeBIP324ECDHSecret(their_pubkey, m_our_pubkey, initiator);

    // Derive encryption keys from shared secret, and initialize stream ciphers and AEADs.
    bool side = (initiator != self_decrypt);
    CHKDF_HMAC_SHA256_L32 hkdf(UCharCast(ecdh_secret.data()), ecdh_secret.size(), salt);
    std::array<std::byte, 32> hkdf_32_okm;
    hkdf.Expand32("initiator_L", UCharCast(hkdf_32_okm.data()));
    (side ? m_send_l_cipher : m_recv_l_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("initiator_P", UCharCast(hkdf_32_okm.data()));
    (side ? m_send_p_cipher : m_recv_p_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("responder_L", UCharCast(hkdf_32_okm.data()));
    (side ? m_recv_l_cipher : m_send_l_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("responder_P", UCharCast(hkdf_32_okm.data()));
    (side ? m_recv_p_cipher : m_send_p_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);

    // Derive garbage terminators from shared secret.
    hkdf.Expand32("garbage_terminators", UCharCast(hkdf_32_okm.data()));
    std::copy(std::begin(hkdf_32_okm), std::begin(hkdf_32_okm) + GARBAGE_TERMINATOR_LEN,
        (initiator ? m_send_garbage_terminator : m_recv_garbage_terminator).begin());
    std::copy(std::end(hkdf_32_okm) - GARBAGE_TERMINATOR_LEN, std::end(hkdf_32_okm),
        (initiator ? m_recv_garbage_terminator : m_send_garbage_terminator).begin());

    // Derive session id from shared secret.
    hkdf.Expand32("session_id", UCharCast(m_session_id.data()));

    // Wipe all variables that contain information which could be used to re-derive encryption keys.
    memory_cleanse(ecdh_secret.data(), ecdh_secret.size());
    memory_cleanse(hkdf_32_okm.data(), sizeof(hkdf_32_okm));
    memory_cleanse(&hkdf, sizeof(hkdf));
    m_key = CKey();
}